

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void action_uniform(tgestate_t *state)

{
  byte bVar1;
  
  if ((state->vischars[0].mi.sprite != sprites + 0x16) && (state->room_index < 0x1d)) {
    state->vischars[0].mi.sprite = sprites + 0x16;
    bVar1 = 0x66;
    if (state->morale < 0x66) {
      bVar1 = state->morale;
    }
    state->morale = bVar1 + 10;
    increase_score(state,'2');
    return;
  }
  return;
}

Assistant:

void action_uniform(tgestate_t *state)
{
  const spritedef_t *guard_sprite; /* was HL */

  assert(state != NULL);

  guard_sprite = &sprites[sprite_GUARD_FACING_AWAY_1];

  if (state->vischars[0].mi.sprite == guard_sprite)
    return; /* Already in uniform. */

  if (state->room_index >= room_29_SECOND_TUNNEL_START)
    return; /* Can't don uniform when in a tunnel. */

  state->vischars[0].mi.sprite = guard_sprite;

  increase_morale_by_10_score_by_50(state);
}